

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

uint Assimp::GetMeshVFormatUnique(aiMesh *pcMesh)

{
  bool bVar1;
  uint local_18;
  uint local_14;
  uint p;
  uint iRet;
  aiMesh *pcMesh_local;
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                  ,0xb6,"unsigned int Assimp::GetMeshVFormatUnique(const aiMesh *)");
  }
  local_14 = 1;
  bVar1 = aiMesh::HasNormals(pcMesh);
  if (bVar1) {
    local_14 = 3;
  }
  bVar1 = aiMesh::HasTangentsAndBitangents(pcMesh);
  if (bVar1) {
    local_14 = local_14 | 4;
  }
  local_18 = 0;
  while (bVar1 = aiMesh::HasTextureCoords(pcMesh,local_18), bVar1) {
    local_14 = 0x100 << ((byte)local_18 & 0x1f) | local_14;
    if (pcMesh->mNumUVComponents[local_18] == 3) {
      local_14 = 0x10000 << ((byte)local_18 & 0x1f) | local_14;
    }
    local_18 = local_18 + 1;
  }
  local_18 = 0;
  while (bVar1 = aiMesh::HasVertexColors(pcMesh,local_18), bVar1) {
    local_14 = 0x1000000 << ((byte)local_18 & 0x1f) | local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

unsigned int GetMeshVFormatUnique(const aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    // FIX: the hash may never be 0. Otherwise a comparison against
    // nullptr could be successful
    unsigned int iRet = 1;

    // normals
    if (pcMesh->HasNormals())iRet |= 0x2;
    // tangents and bitangents
    if (pcMesh->HasTangentsAndBitangents())iRet |= 0x4;

#ifdef BOOST_STATIC_ASSERT
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_COLOR_SETS);
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_TEXTURECOORDS);
#endif

    // texture coordinates
    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        iRet |= (0x100 << p);
        if (3 == pcMesh->mNumUVComponents[p])
            iRet |= (0x10000 << p);

        ++p;
    }
    // vertex colors
    p = 0;
    while (pcMesh->HasVertexColors(p))iRet |= (0x1000000 << p++);
    return iRet;
}